

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Barcode.cpp
# Opt level: O0

string * __thiscall ZXing::Result::ecLevel_abi_cxx11_(Result *this)

{
  allocator<char> *in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  allocator<char> local_11;
  string *__s;
  
  __s = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(unaff_retaddr,(char *)__s,in_RSI);
  std::allocator<char>::~allocator(&local_11);
  return in_RDI;
}

Assistant:

std::string Result::ecLevel() const
{
	return _ecLevel;
}